

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O2

string * cmQtAutoGenerator::SettingsFind(string *__return_storage_ptr__,string *content,char *key)

{
  long lVar1;
  ulong uVar2;
  allocator<char> local_39;
  string prefix;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&prefix,key,&local_39);
  std::__cxx11::string::push_back((char)&prefix);
  lVar1 = std::__cxx11::string::find((string *)content,(ulong)&prefix);
  if ((lVar1 != -1) && (lVar1 + prefix._M_string_length < content->_M_string_length)) {
    uVar2 = std::__cxx11::string::find((char)content,10);
    if (uVar2 != lVar1 + prefix._M_string_length && uVar2 != 0xffffffffffffffff) {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)content);
      goto LAB_0017b0b0;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_0017b0b0:
  std::__cxx11::string::~string((string *)&prefix);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGenerator::SettingsFind(std::string const& content,
                                            const char* key)
{
  std::string prefix(key);
  prefix += ':';
  std::string::size_type pos = content.find(prefix);
  if (pos != std::string::npos) {
    pos += prefix.size();
    if (pos < content.size()) {
      std::string::size_type posE = content.find('\n', pos);
      if ((posE != std::string::npos) && (posE != pos)) {
        return content.substr(pos, posE - pos);
      }
    }
  }
  return std::string();
}